

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * cargo_get_vfprint_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,__va_list_tag *ap)

{
  uint uVar1;
  ulong uVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  char *pcVar5;
  cargo_highlight_t *local_38;
  
  local_38 = (cargo_highlight_t *)_cargo_calloc(highlight_count,0x10);
  pcVar5 = (char *)0x0;
  if (local_38 != (cargo_highlight_t *)0x0) {
    uVar2 = 0;
    if (0 < (int)highlight_count) {
      uVar2 = highlight_count & 0xffffffff;
    }
    for (; (char *)(uVar2 * 0x10) != pcVar5; pcVar5 = pcVar5 + 0x10) {
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar3 = (undefined4 *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        puVar3 = (undefined4 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar3 + 2;
      }
      *(undefined4 *)(pcVar5 + (long)&local_38->i) = *puVar3;
      uVar1 = ap->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        puVar4 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar4 + 1;
      }
      *(undefined8 *)((long)&local_38->c + (long)pcVar5) = *puVar4;
    }
    pcVar5 = cargo_get_fprintl_args(argc,argv,start,flags,max_width,highlight_count,local_38);
  }
  _cargo_xfree(&local_38);
  return pcVar5;
}

Assistant:

char *cargo_get_vfprint_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count, va_list ap)
{
    char *ret = NULL;
    int i;
    cargo_highlight_t *highlights = NULL;

    // Create a list of indices to highlight from the va_args.
    if (!(highlights = _cargo_calloc(highlight_count, sizeof(cargo_highlight_t))))
    {
        CARGODBG(1, "Out of memory trying to allocate %lu highlights!\n",
                highlight_count);
        goto fail;
    }

    for (i = 0; i < (int)highlight_count; i++)
    {
        highlights[i].i = va_arg(ap, int);
        highlights[i].c = va_arg(ap, char *);
    }

    ret = cargo_get_fprintl_args(argc, argv, start, flags, max_width,
                                highlight_count, highlights);

fail:
    _cargo_xfree(&highlights);

    return ret;
}